

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O2

void idx2::Copy<double>(grid *SGrid,volume *SVol,volume *DVol)

{
  grid_iterator<double> DIt;
  grid_iterator<double> SEnd;
  grid_iterator<double> SIt;
  grid_iterator<double> local_c8;
  grid_iterator<double> local_90;
  grid_iterator<double> local_58;
  
  Begin<double>(&local_58,SGrid,SVol);
  End<double>(&local_90,SGrid,SVol);
  Begin<double>(&local_c8,SGrid,DVol);
  while (local_58.Ptr != local_90.Ptr) {
    *local_c8.Ptr = *local_58.Ptr;
    grid_iterator<double>::operator++(&local_58);
    grid_iterator<double>::operator++(&local_c8);
  }
  return;
}

Assistant:

void
Copy(const grid& SGrid, const volume& SVol, volume* DVol)
{
  idx2_Assert(Dims(SGrid) <= Dims(*DVol));
  idx2_Assert(Dims(SGrid) <= Dims(SVol));
  idx2_Assert(DVol->Buffer && SVol.Buffer);
  idx2_Assert(SVol.Type == DVol->Type);

  auto SIt = Begin<t>(SGrid, SVol), SEnd = End<t>(SGrid, SVol);
  auto DIt = Begin<t>(SGrid, *DVol);
  for (; SIt != SEnd; ++SIt, ++DIt)
    *DIt = *SIt;
}